

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_NormalizeSignature_Test::TestBody(CryptoUtil_NormalizeSignature_Test *this)

{
  char *message;
  string local_a0;
  string local_80;
  AssertionResult gtest_ar;
  ByteData byte_data;
  ByteData signature;
  ByteData expect_bytes;
  
  std::__cxx11::string::string
            ((string *)&local_a0,
             "c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee509809307e5e678cf6e55836a8705d16871a040ea369a21a427d2100a7d75deba"
             ,(allocator *)&local_80);
  cfd::core::ByteData::ByteData(&expect_bytes,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5f67f6cf81a19873091aa7c9578fa2e96490e9bfc78ae7e9798004e8252c06287"
             ,(allocator *)&local_80);
  cfd::core::ByteData::ByteData(&signature,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  cfd::core::CryptoUtil::NormalizeSignature(&byte_data,&signature);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a0,&byte_data);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,&expect_bytes);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()","expect_bytes.GetHex().c_str()",
             local_a0._M_dataplus._M_p,local_80._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x1dd,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&expect_bytes);
  return;
}

Assistant:

TEST(CryptoUtil, NormalizeSignature) {
  // FIXME(fujita-cg): replace test data
  // this test data comes from https://www.pebblewind.com/entry/2018/04/27/232427
  const ByteData expect_bytes(
      "c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee509809307e5e678cf6e55836a8705d16871a040ea369a21a427d2100a7d75deba");
  ByteData signature(
      "c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5f67f6cf81a19873091aa7c9578fa2e96490e9bfc78ae7e9798004e8252c06287");
  ByteData byte_data = CryptoUtil::NormalizeSignature(signature);
  // equals data on generate by libwally
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      expect_bytes.GetHex().c_str());
}